

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O0

void __thiscall libDAI::IJGP::IJGP(IJGP *this,IJGP *x)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  DAIAlg<libDAI::RegionGraph> *in_RSI;
  undefined8 *in_RDI;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000018;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_stack_00000020;
  DAIAlg<libDAI::RegionGraph> *in_stack_ffffffffffffffe8;
  
  DAIAlg<libDAI::RegionGraph>::DAIAlg(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR_clone_00d4dad8;
  pp_Var1 = in_RSI[1].super_InferenceAlgorithm._vptr_InferenceAlgorithm;
  uVar2 = *(undefined8 *)
           &in_RSI[1].super_InferenceAlgorithm._properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl;
  uVar3 = *(undefined8 *)
           &in_RSI[1].super_InferenceAlgorithm._properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = *(_Base_ptr *)
            ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var5 = *(_Base_ptr *)
            ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var6 = *(_Base_ptr *)
            ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var7 = *(_Base_ptr *)
            ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
  in_RDI[0x3f] = *(undefined8 *)
                  &in_RSI[1].super_InferenceAlgorithm._properties.
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header;
  in_RDI[0x40] = p_Var5;
  in_RDI[0x41] = p_Var6;
  in_RDI[0x42] = p_Var7;
  in_RDI[0x3d] = pp_Var1;
  in_RDI[0x3e] = uVar2;
  in_RDI[0x3f] = uVar3;
  in_RDI[0x40] = p_Var4;
  in_RDI[0x43] = in_RSI[1].super_InferenceAlgorithm._properties.
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  in_RDI[0x44] = in_RSI[1].super_InferenceAlgorithm._maxdiff;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (in_stack_00000020,in_stack_00000018);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (in_stack_00000020,in_stack_00000018);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

IJGP & operator=( const IJGP & x ) {
                if( this != &x ) {
                    DAIAlgRG::operator=( x );
                    Props       = x.Props;
                    _maxdiff    = x._maxdiff;
                    _iterations = x._iterations;
                    _Qa         = x._Qa;
                    _Qb         = x._Qb;
                    _mes        = x._mes;
                }
                return *this;
            }